

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

StreamingConcatenationExpressionSyntax * __thiscall
slang::parsing::Parser::parseStreamConcatenation(Parser *this,Token openBrace)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *sliceSize;
  SourceLocation SVar3;
  StreamExpressionSyntax *pSVar4;
  undefined4 extraout_var;
  StreamingConcatenationExpressionSyntax *pSVar6;
  Info *pIVar7;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  TokenKind TVar8;
  undefined8 uVar9;
  ulong uVar10;
  Info *pIVar11;
  Token operatorToken;
  Token TVar12;
  Token TVar13;
  Token openBrace_00;
  Token openBraceInner;
  Token local_240;
  Token local_230;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_220;
  undefined1 local_210;
  undefined8 local_208;
  Info *local_200;
  Info *local_1f8;
  undefined8 local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  pointer pTVar5;
  
  pIVar7 = openBrace.info;
  uVar9 = openBrace._0_8_;
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  local_1f8 = TVar12.info;
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  local_1f0 = TVar12._0_8_;
  if (bVar1) {
    sliceSize = (ExpressionSyntax *)0x0;
  }
  else {
    sliceSize = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
  }
  Token::Token(&local_1d8);
  Token::Token(&local_240);
  local_1d8 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((local_1d8._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&local_1d8);
    local_240 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
    pTVar5 = (pointer)0x0;
    pIVar11 = (Info *)0x0;
    goto LAB_003ae40a;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_208 = uVar9;
  local_200 = pIVar7;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  local_230 = TVar12;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar12.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_230);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x520005,SVar3);
    }
    local_240 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_003ae3c6:
    pIVar7 = local_240.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar12.kind);
    if (bVar1) {
      while( true ) {
        pSVar4 = parseStreamExpression(this);
        local_220._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar4;
        local_210 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_220._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar13.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8);
        if (TVar8 == EndOfFile || bVar1) break;
        if (TVar8 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x520005,false);
            if (!bVar1) {
              local_240 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_003ae3c6;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_220._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_210 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_220._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar13.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8);
        if (TVar8 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if (TVar12.info == TVar13.info && TVar12.kind == TVar8) {
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                            (&this->super_ParserBase,(DiagCode)0x520005,true);
          if (!bVar1) break;
        }
        uVar10 = TVar13._0_8_ & 0xffffffff;
        TVar12.info = TVar13.info;
        TVar12.kind = (short)uVar10;
        TVar12._2_1_ = (char)(uVar10 >> 0x10);
        TVar12.numFlags.raw = (char)(uVar10 >> 0x18);
        TVar12.rawLen = (int)(uVar10 >> 0x20);
        local_230 = TVar13;
      }
      local_240 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
      goto LAB_003ae3c6;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar12,CloseBrace,&local_240,(DiagCode)0x520005);
    pIVar7 = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar7);
  pIVar7 = local_200;
  uVar9 = local_208;
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  pIVar11 = extraout_RDX_00;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_003ae40a:
  local_1e8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005dc298;
  operatorToken.info = local_1f8;
  operatorToken.kind = (undefined2)local_1f0;
  operatorToken._2_1_ = local_1f0._2_1_;
  operatorToken.numFlags.raw = local_1f0._3_1_;
  operatorToken.rawLen = local_1f0._4_4_;
  openBrace_00.info = pIVar7;
  openBrace_00.kind = (short)uVar9;
  openBrace_00._2_1_ = (char)((ulong)uVar9 >> 0x10);
  openBrace_00.numFlags.raw = (char)((ulong)uVar9 >> 0x18);
  openBrace_00.rawLen = (int)((ulong)uVar9 >> 0x20);
  auStack_1b0._8_8_ = pIVar11;
  auStack_1b0._16_8_ = pTVar5;
  local_198._M_extent_value = (size_t)pIVar11;
  pSVar6 = slang::syntax::SyntaxFactory::streamingConcatenationExpression
                     (&this->factory,openBrace_00,operatorToken,sliceSize,local_1d8,
                      (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)local_1c8,
                      local_240,local_1e8);
  return pSVar6;
}

Assistant:

StreamingConcatenationExpressionSyntax& Parser::parseStreamConcatenation(Token openBrace) {
    auto op = consume();
    ExpressionSyntax* sliceSize = nullptr;
    if (!peek(TokenKind::OpenBrace))
        sliceSize = &parseExpression();

    Token openBraceInner;
    Token closeBraceInner;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleExpressionOrComma, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBraceInner, list,
        closeBraceInner, RequireItems::True, diag::ExpectedStreamExpression,
        [this] { return &parseStreamExpression(); });

    auto closeBrace = expect(TokenKind::CloseBrace);
    return factory.streamingConcatenationExpression(openBrace, op, sliceSize, openBraceInner, list,
                                                    closeBraceInner, closeBrace);
}